

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_putbit.c
# Opt level: O1

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf,RK_S32 prob,RK_S32 bool_value)

{
  RK_U8 *pRVar1;
  RK_S32 *pRVar2;
  int iVar3;
  RK_U8 *pRVar4;
  
  iVar3 = ((bitbuf->range + -1) * prob >> 8) + 1;
  if (bool_value != 0) {
    bitbuf->bottom = bitbuf->bottom + iVar3;
    iVar3 = bitbuf->range - iVar3;
  }
  bitbuf->range = iVar3;
  while (iVar3 < 0x80) {
    if (bitbuf->bottom < 0) {
      pRVar4 = bitbuf->data;
      while( true ) {
        pRVar1 = pRVar4 + -1;
        pRVar4 = pRVar4 + -1;
        if (*pRVar1 != 0xff) break;
        *pRVar4 = '\0';
      }
      *pRVar4 = *pRVar1 + '\x01';
    }
    bitbuf->range = bitbuf->range << 1;
    iVar3 = bitbuf->bottom * 2;
    bitbuf->bottom = iVar3;
    pRVar2 = &bitbuf->bits_left;
    *pRVar2 = *pRVar2 + -1;
    if (*pRVar2 == 0) {
      pRVar4 = bitbuf->data;
      bitbuf->data = pRVar4 + 1;
      *pRVar4 = (RK_U8)((uint)iVar3 >> 0x18);
      bitbuf->byte_cnt = bitbuf->byte_cnt + 1;
      *(undefined1 *)((long)&bitbuf->bottom + 3) = 0;
      bitbuf->bits_left = 8;
    }
    iVar3 = bitbuf->range;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_put_bool(Vp8ePutBitBuf *bitbuf, RK_S32 prob, RK_S32 bool_value)
{
    RK_S32 split = 1 + ((bitbuf->range - 1) * prob >> 8);

    if (bool_value) {
        bitbuf->bottom += split;
        bitbuf->range -= split;
    } else {
        bitbuf->range = split;
    }

    while (bitbuf->range < 128) {
        if (bitbuf->bottom < 0) {
            RK_U8 *data = bitbuf->data;
            while (*--data == 255) {
                *data = 0;
            }
            (*data)++;
        }
        bitbuf->range <<= 1;
        bitbuf->bottom <<= 1;

        if (!--bitbuf->bits_left) {
            *bitbuf->data++ = (bitbuf->bottom >> 24) & 0xff;
            bitbuf->byte_cnt++;
            bitbuf->bottom &= 0xffffff;     /* Keep 3 bytes */
            bitbuf->bits_left = 8;
        }
    }
    return MPP_OK;
}